

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lca.cpp
# Opt level: O3

int lca(int a,int b)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  
  iVar3 = b;
  if (d[a] < d[b]) {
    iVar3 = a;
    a = b;
  }
  lVar4 = 0x4c;
  do {
    iVar1 = *(int *)((long)pred[a] + lVar4);
    if (((long)iVar1 != -1) && (d[iVar3] <= d[iVar1])) {
      a = iVar1;
    }
    lVar4 = lVar4 + -4;
  } while (lVar4 != -4);
  if (a != iVar3) {
    lVar4 = 0x4c;
    do {
      iVar1 = *(int *)((long)pred[a] + lVar4);
      iVar2 = *(int *)((long)pred[iVar3] + lVar4);
      if (iVar1 != iVar2) {
        iVar3 = iVar2;
        a = iVar1;
      }
      lVar4 = lVar4 + -4;
    } while (lVar4 != -4);
    iVar3 = pred[a][0];
  }
  return iVar3;
}

Assistant:

int lca(int a, int b) {
    if (d[a] < d[b]) swap(a, b);
    per(l, 0, LOG) {
        if (pred[a][l] != -1 && d[pred[a][l]] >= d[b]) a = pred[a][l];
    }
    if (a == b) return a;
    per(l, 0, LOG) if (pred[a][l] != pred[b][l]) {
        a = pred[a][l];
        b = pred[b][l];
    }
    return pred[a][0];
}